

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcOrientation_simplified
          (DeadReckoningCalculator *this,EulerAngles *OrientationOut,KFLOAT32 totalTimeSinceReset)

{
  float fVar1;
  KBOOL KVar2;
  KFLOAT32 *pKVar3;
  KFLOAT32 KVar4;
  EulerAngles local_50;
  EulerAngles local_38;
  KFLOAT32 local_1c;
  EulerAngles *pEStack_18;
  KFLOAT32 totalTimeSinceReset_local;
  EulerAngles *OrientationOut_local;
  DeadReckoningCalculator *this_local;
  
  local_1c = totalTimeSinceReset;
  pEStack_18 = OrientationOut;
  OrientationOut_local = (EulerAngles *)this;
  DATA_TYPE::EulerAngles::operator*
            (&local_50,&this->m_initEulerAngularVelocity,
             (KFLOAT64)(double)(float)totalTimeSinceReset);
  DATA_TYPE::EulerAngles::operator+(&local_38,&this->m_initOrientation,&local_50);
  DATA_TYPE::EulerAngles::operator=(pEStack_18,&local_38);
  DATA_TYPE::EulerAngles::~EulerAngles(&local_38);
  DATA_TYPE::EulerAngles::~EulerAngles(&local_50);
  pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,1);
  KVar2 = equivalent<float>((float)*pKVar3,1.5707964,0.001);
  if (KVar2) {
    pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,0);
    fVar1 = (float)*pKVar3;
    pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,0);
    *pKVar3 = (KFLOAT32)(3.1415927 - fVar1);
    pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,1);
    if (0.0 < (float)*pKVar3 || (float)*pKVar3 == 0.0) {
      pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,1);
      if (0.0 < (float)*pKVar3) {
        pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,1);
        fVar1 = (float)*pKVar3;
        pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,1);
        *pKVar3 = (KFLOAT32)(1.5707964 - fVar1);
      }
    }
    else {
      pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,1);
      fVar1 = (float)*pKVar3;
      pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,1);
      *pKVar3 = (KFLOAT32)(-1.5707964 - fVar1);
    }
  }
  pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,0);
  KVar4 = checkAngleHR(*pKVar3);
  pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,0);
  *pKVar3 = KVar4;
  pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,2);
  KVar4 = checkAngleHR(*pKVar3);
  pKVar3 = DATA_TYPE::EulerAngles::operator[](pEStack_18,2);
  *pKVar3 = KVar4;
  return;
}

Assistant:

void DeadReckoningCalculator::calcOrientation_simplified( EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset )
{
    /* Orientation */
    // A simpler way from the IEEE method:
    /*
        m_curOrientation += ( toEulerAngularVelocity( m_initAngularVelocity, m_curOrientation ) * DeltaTime );
    */
    OrientationOut = m_initOrientation + m_initEulerAngularVelocity * totalTimeSinceReset;
    // make sure the Pitch is between -90 and +90 degrees
    // also handle the discontinuity when Pitch is very close to +-90
    if( equivalent<KFLOAT32>( OrientationOut[1], KDIS_PI_2, MAGIC_EPSILON * 100 ) ) {
        OrientationOut[0] = KDIS_PI - OrientationOut[0]; //reflecting the heading angle, to avoid discontinuity
        if (OrientationOut[1] < 0)
            OrientationOut[1] =  (-KDIS_PI_2-OrientationOut[1]);
        else if (OrientationOut[1] > 0)
            OrientationOut[1] = (KDIS_PI_2-OrientationOut[1]);
    }

    // Make sure the value is within -180 and +180 degrees for Heading and Roll.
    OrientationOut[0] = checkAngleHR( OrientationOut[0]);
    OrientationOut[2] = checkAngleHR( OrientationOut[2]);
}